

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O0

FilterList * __thiscall eglu::FilterList::operator<<(FilterList *this,FilterList *other)

{
  size_type sVar1;
  size_type sVar2;
  __normal_iterator<bool_(**)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
  local_40;
  _func_bool_CandidateConfig_ptr **local_38;
  __normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
  local_30;
  __normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
  local_28;
  size_type local_20;
  size_t oldEnd;
  FilterList *other_local;
  FilterList *this_local;
  
  oldEnd = (size_t)other;
  other_local = this;
  local_20 = std::
             vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
             ::size(&this->m_rules);
  sVar1 = std::
          vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ::size(&this->m_rules);
  sVar2 = std::
          vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ::size((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                  *)oldEnd);
  std::
  vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::resize(&this->m_rules,sVar1 + sVar2);
  local_28._M_current =
       (_func_bool_CandidateConfig_ptr **)
       std::
       vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ::begin((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                *)oldEnd);
  local_30._M_current =
       (_func_bool_CandidateConfig_ptr **)
       std::
       vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ::end((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
              *)oldEnd);
  local_40._M_current =
       (_func_bool_CandidateConfig_ptr **)
       std::
       vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ::begin(&this->m_rules);
  local_38 = (_func_bool_CandidateConfig_ptr **)
             __gnu_cxx::
             __normal_iterator<bool_(**)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
             ::operator+(&local_40,local_20);
  std::
  copy<__gnu_cxx::__normal_iterator<bool(*const*)(eglu::CandidateConfig_const&),std::vector<bool(*)(eglu::CandidateConfig_const&),std::allocator<bool(*)(eglu::CandidateConfig_const&)>>>,__gnu_cxx::__normal_iterator<bool(**)(eglu::CandidateConfig_const&),std::vector<bool(*)(eglu::CandidateConfig_const&),std::allocator<bool(*)(eglu::CandidateConfig_const&)>>>>
            (local_28,local_30,
             (__normal_iterator<bool_(**)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
              )local_38);
  return this;
}

Assistant:

FilterList& FilterList::operator<< (const FilterList& other)
{
	size_t oldEnd = m_rules.size();
	m_rules.resize(m_rules.size()+other.m_rules.size());
	std::copy(other.m_rules.begin(), other.m_rules.end(), m_rules.begin()+oldEnd);
	return *this;
}